

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dconnected.cpp
# Opt level: O1

void __thiscall DReachabilityPropagator::wakeup(DReachabilityPropagator *this,int i,int param_2)

{
  int iVar1;
  BoolView *pBVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  uint local_14;
  DReachabilityPropagator *local_10;
  
  iVar1 = (this->in_nodes_tsize).v;
  local_14 = i;
  if (iVar1 < this->in_nodes_size) {
    std::vector<int,_std::allocator<int>_>::resize(&this->in_nodes_list,(long)iVar1);
    this->in_nodes_size = (this->in_nodes_tsize).v;
  }
  lVar6 = (long)(int)local_14;
  bVar3 = true;
  if ((-1 < lVar6) && ((int)local_14 < (int)(this->super_GraphPropagator).vs.sz)) {
    pBVar2 = (this->super_GraphPropagator).vs.data;
    uVar5 = (uint)pBVar2[lVar6].s;
    if ((uVar5 * -2 + 1 == (int)sat.assigns.data[(uint)pBVar2[lVar6].v]) &&
       (this->last_state_n[lVar6].v != 0)) {
      add_innode(this,local_14);
      lVar7 = 0xd8;
    }
    else if ((uVar5 * 2 + -1 != (int)sat.assigns.data[(uint)pBVar2[lVar6].v]) ||
            (lVar7 = 0x108, this->last_state_n[lVar6].v == 1)) goto LAB_001d0534;
    std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
    _M_insert_unique<int_const&>
              ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
               ((long)&(this->super_GraphPropagator).super_Propagator._vptr_Propagator + lVar7),
               (int *)&local_14);
    bVar3 = false;
  }
LAB_001d0534:
  uVar5 = (this->super_GraphPropagator).vs.sz;
  uVar4 = local_14 - uVar5;
  if (((int)uVar5 <= (int)local_14) &&
     ((int)local_14 < (int)(uVar5 + (this->super_GraphPropagator).es.sz))) {
    pBVar2 = (this->super_GraphPropagator).es.data;
    uVar5 = (uint)pBVar2[uVar4].s;
    local_14 = uVar4;
    if (((uVar5 * -2 + 1 == (int)sat.assigns.data[(uint)pBVar2[uVar4].v]) &&
        (lVar6 = 0x138, this->last_state_e[(int)uVar4].v != 0)) ||
       ((uVar5 * 2 + -1 == (int)sat.assigns.data[(uint)pBVar2[uVar4].v] &&
        (lVar6 = 0x168, this->last_state_e[(int)uVar4].v != 1)))) {
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 ((long)&(this->super_GraphPropagator).super_Propagator._vptr_Propagator + lVar6),
                 (int *)&local_14);
      bVar3 = false;
    }
  }
  if ((!bVar3) && ((this->super_GraphPropagator).super_Propagator.in_queue == false)) {
    (this->super_GraphPropagator).super_Propagator.in_queue = true;
    local_10 = this;
    vec<Propagator_*>::push
              (engine.p_queue.data + (uint)(this->super_GraphPropagator).super_Propagator.priority,
               (Propagator **)&local_10);
  }
  return;
}

Assistant:

void DReachabilityPropagator::wakeup(int i, int /*c*/) {
	update_innodes();

	bool ignore = true;
	if (DEBUG) {
		std::cout << "Wake up " << i << '\n';
	}
	if (i >= 0 && i < nbNodes()) {
		assert(getNodeVar(i).isFixed());
		if (getNodeVar(i).isTrue() && last_state_n[i] != VT_IN) {
			if (DEBUG) {
				std::cout << "WakeUp Add node " << i << '\n';
			}
			if (DEBUG) {
				std::cout << "Adding in " << __FILE__ << __LINE__ << '\n';
			}
			add_innode(i);
			new_node.insert(i);
			ignore = false;
		} else if (getNodeVar(i).isFalse() && last_state_n[i] != VT_OUT) {
			if (DEBUG) {
				std::cout << "WakeUp Rem node " << i << '\n';
			}
			rem_node.insert(i);
			ignore = false;
		} else {
			if (DEBUG) {
				std::cout << "Ignoring node " << i << '\n';
			}
		}
	}

	if (i >= nbNodes() && i < nbNodes() + nbEdges()) {
		i = i - nbNodes();
		assert(getEdgeVar(i).isFixed());
		if (getEdgeVar(i).isTrue() && last_state_e[i] != VT_IN) {
			if (DEBUG) {
				std::cout << "WakeUp Add edge" << i << '\n';
			}
			new_edge.insert(i);
			ignore = false;
		} else if (getEdgeVar(i).isFalse() && last_state_e[i] != VT_OUT) {
			if (DEBUG) {
				std::cout << "WakeUp Rem edge " << i << '\n';
			}
			rem_edge.insert(i);
			ignore = false;
		} else {
			if (DEBUG) {
				std::cout << "Ignoring edge " << i << '\n';
			}
		}
	}

	if (!ignore) {
		pushInQueue();
	} else {
	}
}